

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

SceneObject * __thiscall
CMU462::DynamicScene::Mesh::get_transformed_static_object(Mesh *this,double t)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  double dVar2;
  _Base_ptr p_Var3;
  _List_node_base *p_Var4;
  double *pdVar5;
  Mesh *this_00;
  pointer pVVar6;
  int i;
  int i_00;
  long lVar7;
  int j;
  int j_00;
  _List_node_base *p_Var8;
  float fVar9;
  float theta;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  Vector3D scale;
  Vector4D tmp;
  Matrix4x4 R_homogeneous;
  Matrix3x3 R;
  Matrix3x3 Rz;
  Matrix3x3 Ry;
  Matrix3x3 Rx;
  Matrix4x4 S;
  Matrix4x4 transform;
  Matrix4x4 T;
  float local_47c;
  _Base_ptr local_470;
  _Base_ptr local_468;
  _Base_ptr local_460;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_458;
  _Base_ptr local_438 [3];
  Vector4D local_420;
  _List_node_base *local_400;
  _List_node_base *p_Stack_3f8;
  _List_node_base *local_3f0;
  Matrix4x4 local_3e8;
  Vector3D local_368;
  Matrix4x4 local_350;
  Matrix3x3 local_2d0;
  Matrix3x3 local_288;
  Matrix3x3 local_240;
  Matrix3x3 local_1f8;
  Matrix4x4 local_1b0;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  local_458.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    local_460 = (_Base_ptr)0x0;
    local_468 = (_Base_ptr)0x0;
    local_470 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    local_470 = p_Var3[1]._M_parent;
    local_468 = p_Var3[1]._M_left;
    local_460 = p_Var3[1]._M_right;
  }
  if ((this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    theta = 0.0;
    fVar9 = 0.0;
    local_47c = 0.0;
  }
  else {
    p_Var3 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    fVar9 = (float)(double)p_Var3[1]._M_parent;
    local_47c = (float)(double)p_Var3[1]._M_left;
    theta = (float)(double)p_Var3[1]._M_right;
  }
  if ((this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  {
    local_438[0] = (_Base_ptr)0x0;
    local_438[1] = (_Base_ptr)0x0;
    local_438[2] = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    local_438[0] = p_Var3[1]._M_parent;
    local_438[1] = p_Var3[1]._M_left;
    local_438[2] = p_Var3[1]._M_right;
  }
  Matrix4x4::identity();
  lVar7 = 0;
  do {
    p_Var3 = local_438[lVar7];
    pdVar5 = Matrix4x4::operator()(&local_1b0,(int)lVar7,(int)lVar7);
    *pdVar5 = (double)p_Var3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  rotateMatrix(&local_1f8,1.0,0.0,0.0,fVar9);
  rotateMatrix(&local_240,0.0,1.0,0.0,local_47c);
  rotateMatrix(&local_288,0.0,0.0,1.0,theta);
  Matrix3x3::operator*((Matrix3x3 *)&local_350,&local_1f8,&local_240);
  Matrix3x3::operator*(&local_2d0,(Matrix3x3 *)&local_350,&local_288);
  Matrix4x4::identity();
  i_00 = 0;
  do {
    j_00 = 0;
    do {
      pdVar5 = Matrix3x3::operator()(&local_2d0,i_00,j_00);
      dVar2 = *pdVar5;
      pdVar5 = Matrix4x4::operator()(&local_350,i_00,j_00);
      *pdVar5 = dVar2;
      j_00 = j_00 + 1;
    } while (j_00 != 3);
    i_00 = i_00 + 1;
  } while (i_00 != 3);
  local_368.x = (double)local_470;
  local_368.y = (double)local_468;
  local_368.z = (double)local_460;
  Matrix4x4::translation(&local_368);
  Matrix4x4::operator*(&local_3e8,&local_b0,&local_350);
  Matrix4x4::operator*(&local_130,&local_3e8,&local_1b0);
  plVar1 = &(this->mesh).vertices;
  p_Var8 = (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)plVar1) {
    do {
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                (&local_458,(value_type *)&p_Var8[1]._M_prev);
      fVar9 = *(float *)((long)&p_Var8[6]._M_prev + 4);
      Vertex::normal((Vector3D *)&local_420,(Vertex *)(p_Var8 + 1));
      dVar2 = (double)fVar9;
      local_3e8.entries[0].x = local_420.x * dVar2 + (double)p_Var8[1]._M_prev;
      local_3e8.entries[0].y = local_420.y * dVar2 + (double)p_Var8[2]._M_next;
      local_3e8.entries[0].z = dVar2 * local_420.z + (double)p_Var8[2]._M_prev;
      local_3e8.entries[0].w = 1.0;
      Matrix4x4::operator*(&local_130,local_3e8.entries);
      Vector4D::to3D(&local_420);
      p_Var8[2]._M_prev = local_3f0;
      p_Var8[1]._M_prev = local_400;
      p_Var8[2]._M_next = p_Stack_3f8;
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)plVar1);
  }
  this_00 = (Mesh *)operator_new(0x38);
  StaticScene::Mesh::Mesh(this_00,&this->mesh,this->bsdf);
  pVVar6 = local_458.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl
           .super__Vector_impl_data._M_start;
  for (p_Var8 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var8 != (_List_node_base *)plVar1;
      p_Var8 = p_Var8->_M_next) {
    p_Var8[2]._M_prev = (_List_node_base *)pVVar6->z;
    p_Var4 = (_List_node_base *)pVVar6->y;
    p_Var8[1]._M_prev = (_List_node_base *)pVVar6->x;
    p_Var8[2]._M_next = p_Var4;
    pVVar6 = pVVar6 + 1;
  }
  if (local_458.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.
                    super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_458.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_SceneObject;
}

Assistant:

StaticScene::SceneObject *Mesh::get_transformed_static_object(double t) {
  vector<Vector3D> originalPositions;

  Vector3D position = positions(t);
  Vector3D rotate = rotations(t);
  Vector3D scale = scales(t);

  Matrix4x4 S = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) S(i,i) = scale[i];

  Matrix3x3 Rx = rotateMatrix(1, 0, 0, rotate[0]);
  Matrix3x3 Ry = rotateMatrix(0, 1, 0, rotate[1]);
  Matrix3x3 Rz = rotateMatrix(0, 0, 1, rotate[2]);

  Matrix3x3 R = Rx * Ry * Rz;
  Matrix4x4 R_homogeneous = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R_homogeneous(i,j) = R(i,j);
    }
  }

  Matrix4x4 T = Matrix4x4::translation(position);

  Matrix4x4 transform = T * R_homogeneous * S;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector4D tmp = Vector4D(v->position + v->offset * v->normal(), 1.0);
    v->position = (transform * tmp).to3D();
  }

  StaticScene::SceneObject *output = new StaticScene::Mesh(mesh, bsdf);

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }

  return output;
}